

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibReader.cpp
# Opt level: O1

bool __thiscall ZlibReader::reset_zlib(ZlibReader *this)

{
  uLong uVar1;
  int iVar2;
  
  if (this->initialized == true) {
    inflateEnd(&this->z);
  }
  (this->z).zalloc = (alloc_func)0x0;
  (this->z).zfree = (free_func)0x0;
  (this->z).opaque = (voidpf)0x0;
  iVar2 = inflateInit_(&this->z,"1.2.11",0x70);
  this->zpos = 0;
  this->pos = 0;
  uVar1 = crc32(0,0,0);
  this->crc = uVar1;
  return iVar2 == 0;
}

Assistant:

bool ZlibReader::reset_zlib()
{
	int zresult;

	if (initialized)
	{
		inflateEnd(&z);
	}

	z.zalloc = Z_NULL;
	z.zfree = Z_NULL;
	z.opaque = Z_NULL;
	zresult = inflateInit(&z);

	zpos = 0;
	pos = 0;

	reset_crc32();

	return (zresult == Z_OK);
}